

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffprec(fitsfile *fptr,char *card,int *status)

{
  int iVar1;
  int iVar2;
  char *bytepos;
  size_t sVar3;
  int *in_RDX;
  fitsfile *in_RSI;
  int *in_RDI;
  int keylength;
  long nblocks;
  size_t ii;
  size_t len;
  char tcard [81];
  int *in_stack_00001690;
  int in_stack_0000169c;
  long in_stack_000016a0;
  fitsfile *in_stack_000016a8;
  undefined4 in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  char *pcVar4;
  char *s1;
  ulong uVar5;
  fitsfile *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  int *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8;
  undefined1 uVar6;
  undefined7 in_stack_ffffffffffffffd9;
  int local_4;
  
  if (*in_RDX < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_RSI,(int)((ulong)in_RDX >> 0x20),
             (int *)CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd0);
    }
    if (*(long *)(*(long *)(in_RDI + 2) + 0x88) - *(long *)(*(long *)(in_RDI + 2) + 0x70) == 0x50) {
      in_stack_ffffffffffffff70 = (int *)0x1;
      iVar1 = ffiblk(in_stack_000016a8,in_stack_000016a0,in_stack_0000169c,in_stack_00001690);
      if (0 < iVar1) {
        return *in_RDX;
      }
    }
    strncpy(&stack0xffffffffffffff88,(char *)in_RSI,0x50);
    uVar6 = 0;
    bytepos = (char *)strlen(&stack0xffffffffffffff88);
    for (pcVar4 = (char *)0x0; s1 = bytepos, pcVar4 < bytepos; pcVar4 = pcVar4 + 1) {
      if (((char)(&stack0xffffffffffffff88)[(long)pcVar4] < ' ') ||
         ('~' < (char)(&stack0xffffffffffffff88)[(long)pcVar4])) {
        (&stack0xffffffffffffff88)[(long)pcVar4] = 0x20;
      }
    }
    for (; s1 < (char *)0x50; s1 = s1 + 1) {
      (&stack0xffffffffffffff88)[(long)s1] = 0x20;
    }
    sVar3 = strcspn(&stack0xffffffffffffff88,"=");
    iVar1 = (int)sVar3;
    if (iVar1 == 0x50) {
      iVar1 = 8;
    }
    iVar2 = fits_strncasecmp(s1,(char *)in_stack_ffffffffffffff70,
                             CONCAT44(iVar1,in_stack_ffffffffffffff68));
    if ((((iVar2 == 0) ||
         (iVar2 = fits_strncasecmp(s1,(char *)in_stack_ffffffffffffff70,
                                   CONCAT44(iVar1,in_stack_ffffffffffffff68)), iVar2 == 0)) ||
        (iVar2 = fits_strncasecmp(s1,(char *)in_stack_ffffffffffffff70,
                                  CONCAT44(iVar1,in_stack_ffffffffffffff68)), iVar2 == 0)) ||
       (iVar2 = fits_strncasecmp(s1,(char *)in_stack_ffffffffffffff70,
                                 CONCAT44(iVar1,in_stack_ffffffffffffff68)), iVar2 == 0)) {
      iVar1 = 8;
    }
    for (uVar5 = 0; uVar5 < (ulong)(long)iVar1; uVar5 = uVar5 + 1) {
      iVar2 = toupper((int)(char)(&stack0xffffffffffffff88)[uVar5]);
      (&stack0xffffffffffffff88)[uVar5] = (char)iVar2;
    }
    fftkey((char *)in_RSI,in_RDX);
    ffmbyt(in_stack_ffffffffffffff88,(LONGLONG)bytepos,(int)(uVar5 >> 0x20),
           in_stack_ffffffffffffff70);
    ffpbyt((fitsfile *)CONCAT71(in_stack_ffffffffffffffd9,uVar6),(LONGLONG)in_stack_ffffffffffffffd0
           ,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (*in_RDX < 1) {
      *(long *)(*(long *)(in_RDI + 2) + 0x70) = *(long *)(*(long *)(in_RDI + 2) + 0x70) + 0x50;
    }
    local_4 = *in_RDX;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffprec(fitsfile *fptr,     /* I - FITS file pointer        */
           const char *card,   /* I - string to be written     */
           int *status)        /* IO - error status            */
/*
  write a keyword record (80 bytes long) to the end of the header
*/
{
    char tcard[FLEN_CARD];
    size_t len, ii;
    long nblocks;
    int keylength;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ( ((fptr->Fptr)->datastart - (fptr->Fptr)->headend) == 80) /* no room */
    {
        nblocks = 1;
        if (ffiblk(fptr, nblocks, 0, status) > 0) /* insert 2880-byte block */
            return(*status);  
    }

    strncpy(tcard,card,80);
    tcard[80] = '\0';

    len = strlen(tcard);

    /* silently replace any illegal characters with a space */
    for (ii=0; ii < len; ii++)   
        if (tcard[ii] < ' ' || tcard[ii] > 126) tcard[ii] = ' ';

    for (ii=len; ii < 80; ii++)    /* fill card with spaces if necessary */
        tcard[ii] = ' ';

    keylength = strcspn(tcard, "=");   /* support for free-format keywords */
    if (keylength == 80) keylength = 8;
    
    /* test for the common commentary keywords which by definition have 8-char names */
    if ( !fits_strncasecmp( "COMMENT ", tcard, 8) || !fits_strncasecmp( "HISTORY ", tcard, 8) ||
         !fits_strncasecmp( "        ", tcard, 8) || !fits_strncasecmp( "CONTINUE", tcard, 8) )
	 keylength = 8;

    for (ii=0; ii < keylength; ii++)       /* make sure keyword name is uppercase */
        tcard[ii] = toupper(tcard[ii]);

    fftkey(tcard, status);        /* test keyword name contains legal chars */

/*  no need to do this any more, since any illegal characters have been removed
    fftrec(tcard, status);  */        /* test rest of keyword for legal chars */

    ffmbyt(fptr, (fptr->Fptr)->headend, IGNORE_EOF, status); /* move to end */

    ffpbyt(fptr, 80, tcard, status);   /* write the 80 byte card */

    if (*status <= 0)
       (fptr->Fptr)->headend += 80;    /* update end-of-header position */

    return(*status);
}